

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int isLikeOrGlob(Parse *pParse,Expr *pExpr,Expr **ppPrefix,int *pisComplete,int *pnoCase)

{
  u8 uVar1;
  short sVar2;
  sqlite3 *db_00;
  SrcList *pExpr_00;
  byte *pbVar3;
  Vdbe *v_00;
  char cVar4;
  int iVar5;
  int iVar6;
  Expr *pExpr_01;
  Expr *p;
  bool bVar7;
  bool local_b6;
  int r1;
  Vdbe *v;
  char *zNew;
  int iTo;
  int iFrom;
  Expr *pPrefix;
  int iCol;
  Vdbe *pReprepare;
  int rc;
  int op;
  sqlite3_value *pVal;
  sqlite3 *db;
  int local_60;
  u8 wc [4];
  int cnt;
  u8 c;
  ExprList *pList;
  Expr *pLeft;
  Expr *pRight;
  u8 *z;
  int *pnoCase_local;
  int *pisComplete_local;
  Expr **ppPrefix_local;
  Expr *pExpr_local;
  Parse *pParse_local;
  
  pRight = (Expr *)0x0;
  db_00 = pParse->db;
  _rc = (sqlite3_value *)0x0;
  iVar5 = sqlite3IsLikeFunction(db_00,pExpr,pnoCase,(char *)((long)&db + 4));
  if (iVar5 == 0) {
    pParse_local._4_4_ = 0;
  }
  else {
    pExpr_00 = ((pExpr->x).pSelect)->pSrc;
    pExpr_01 = sqlite3ExprSkipCollate(*(Expr **)&((pExpr->x).pSelect)->op);
    uVar1 = pExpr_01->op;
    if ((uVar1 == 0x94) && ((db_00->flags & 0x800000) == 0)) {
      sVar2 = pExpr_01->iColumn;
      _rc = sqlite3VdbeGetBoundValue(pParse->pReprepare,(int)sVar2,'A');
      if ((_rc != (sqlite3_value *)0x0) && (iVar5 = sqlite3_value_type(_rc), iVar5 == 3)) {
        pRight = (Expr *)sqlite3_value_text(_rc);
      }
      sqlite3VdbeSetVarmask(pParse->pVdbe,(int)sVar2);
    }
    else if (uVar1 == 'n') {
      pRight = (Expr *)(pExpr_01->u).zToken;
    }
    if (pRight != (Expr *)0x0) {
      local_60 = 0;
      iVar5 = local_60;
      while( true ) {
        local_60 = iVar5;
        wc[3] = (&pRight->op)[local_60];
        bVar7 = false;
        if (((wc[3] != 0) && (bVar7 = false, wc[3] != db._4_1_)) &&
           (bVar7 = false, wc[3] != db._5_1_)) {
          bVar7 = wc[3] != db._6_1_;
        }
        if (!bVar7) break;
        iVar5 = local_60 + 1;
        if ((wc[3] == db._7_1_) && ((&pRight->op)[iVar5] != '\0')) {
          iVar5 = local_60 + 2;
        }
      }
      if (((local_60 == 0) || ((&pRight->op)[local_60 + -1] == 0xff)) ||
         ((local_60 < 2 && (pRight->op == db._7_1_)))) {
        pRight = (Expr *)0x0;
      }
      else {
        local_b6 = false;
        if (wc[3] == db._4_1_) {
          local_b6 = (&pRight->op)[local_60 + 1] == '\0';
        }
        *pisComplete = (uint)local_b6;
        p = sqlite3Expr(db_00,0x6e,(char *)pRight);
        if (p != (Expr *)0x0) {
          pbVar3 = (byte *)(p->u).zToken;
          pbVar3[local_60] = 0;
          zNew._0_4_ = 0;
          for (zNew._4_4_ = 0; zNew._4_4_ < local_60; zNew._4_4_ = zNew._4_4_ + 1) {
            if ((int)(char)pbVar3[zNew._4_4_] == (uint)db._7_1_) {
              zNew._4_4_ = zNew._4_4_ + 1;
            }
            pbVar3[(int)zNew] = pbVar3[zNew._4_4_];
            zNew._0_4_ = (int)zNew + 1;
          }
          pbVar3[(int)zNew] = 0;
          if (((((""[*pbVar3] & 4) != 0) || (*pbVar3 == 0x2d)) ||
              ((*pbVar3 == 0x2f && ((int)zNew == 1)))) &&
             ((((u8)pExpr_00->nSrc != 0xa2 ||
               (cVar4 = sqlite3ExprAffinity((Expr *)pExpr_00), cVar4 != 'B')) ||
              (((anon_union_8_3_c79b3df9_for_y *)((anon_union_8_2_443a03b8_for_u *)pExpr_00->a + 7))
               ->pTab->nModuleArg != 0)))) {
            sqlite3ExprDelete(db_00,p);
            sqlite3ValueFree(_rc);
            return 0;
          }
        }
        *ppPrefix = p;
        if (uVar1 == 0x94) {
          v_00 = pParse->pVdbe;
          sqlite3VdbeSetVarmask(v_00,(int)pExpr_01->iColumn);
          if ((*pisComplete != 0) && ((pExpr_01->u).zToken[1] != '\0')) {
            iVar5 = sqlite3GetTempReg(pParse);
            sqlite3ExprCodeTarget(pParse,pExpr_01,iVar5);
            iVar6 = sqlite3VdbeCurrentAddr(v_00);
            sqlite3VdbeChangeP3(v_00,iVar6 - 1,0);
            sqlite3ReleaseTempReg(pParse,iVar5);
          }
        }
      }
    }
    pParse_local._4_4_ = (uint)(pRight != (Expr *)0x0);
    sqlite3ValueFree(_rc);
  }
  return pParse_local._4_4_;
}

Assistant:

static int isLikeOrGlob(
  Parse *pParse,    /* Parsing and code generating context */
  Expr *pExpr,      /* Test this expression */
  Expr **ppPrefix,  /* Pointer to TK_STRING expression with pattern prefix */
  int *pisComplete, /* True if the only wildcard is % in the last character */
  int *pnoCase      /* True if uppercase is equivalent to lowercase */
){
  const u8 *z = 0;           /* String on RHS of LIKE operator */
  Expr *pRight, *pLeft;      /* Right and left size of LIKE operator */
  ExprList *pList;           /* List of operands to the LIKE operator */
  u8 c;                      /* One character in z[] */
  int cnt;                   /* Number of non-wildcard prefix characters */
  u8 wc[4];                  /* Wildcard characters */
  sqlite3 *db = pParse->db;  /* Database connection */
  sqlite3_value *pVal = 0;
  int op;                    /* Opcode of pRight */
  int rc;                    /* Result code to return */

  if( !sqlite3IsLikeFunction(db, pExpr, pnoCase, (char*)wc) ){
    return 0;
  }
#ifdef SQLITE_EBCDIC
  if( *pnoCase ) return 0;
#endif
  pList = pExpr->x.pList;
  pLeft = pList->a[1].pExpr;

  pRight = sqlite3ExprSkipCollate(pList->a[0].pExpr);
  op = pRight->op;
  if( op==TK_VARIABLE && (db->flags & SQLITE_EnableQPSG)==0 ){
    Vdbe *pReprepare = pParse->pReprepare;
    int iCol = pRight->iColumn;
    pVal = sqlite3VdbeGetBoundValue(pReprepare, iCol, SQLITE_AFF_BLOB);
    if( pVal && sqlite3_value_type(pVal)==SQLITE_TEXT ){
      z = sqlite3_value_text(pVal);
    }
    sqlite3VdbeSetVarmask(pParse->pVdbe, iCol);
    assert( pRight->op==TK_VARIABLE || pRight->op==TK_REGISTER );
  }else if( op==TK_STRING ){
    z = (u8*)pRight->u.zToken;
  }
  if( z ){

    /* Count the number of prefix characters prior to the first wildcard */
    cnt = 0;
    while( (c=z[cnt])!=0 && c!=wc[0] && c!=wc[1] && c!=wc[2] ){
      cnt++;
      if( c==wc[3] && z[cnt]!=0 ) cnt++;
    }

    /* The optimization is possible only if (1) the pattern does not begin
    ** with a wildcard and if (2) the non-wildcard prefix does not end with
    ** an (illegal 0xff) character, or (3) the pattern does not consist of
    ** a single escape character. The second condition is necessary so
    ** that we can increment the prefix key to find an upper bound for the
    ** range search. The third is because the caller assumes that the pattern
    ** consists of at least one character after all escapes have been
    ** removed.  */
    if( cnt!=0 && 255!=(u8)z[cnt-1] && (cnt>1 || z[0]!=wc[3]) ){
      Expr *pPrefix;

      /* A "complete" match if the pattern ends with "*" or "%" */
      *pisComplete = c==wc[0] && z[cnt+1]==0;

      /* Get the pattern prefix.  Remove all escapes from the prefix. */
      pPrefix = sqlite3Expr(db, TK_STRING, (char*)z);
      if( pPrefix ){
        int iFrom, iTo;
        char *zNew = pPrefix->u.zToken;
        zNew[cnt] = 0;
        for(iFrom=iTo=0; iFrom<cnt; iFrom++){
          if( zNew[iFrom]==wc[3] ) iFrom++;
          zNew[iTo++] = zNew[iFrom];
        }
        zNew[iTo] = 0;

        /* If the RHS begins with a digit or a minus sign, then the LHS must be
        ** an ordinary column (not a virtual table column) with TEXT affinity.
        ** Otherwise the LHS might be numeric and "lhs >= rhs" would be false
        ** even though "lhs LIKE rhs" is true.  But if the RHS does not start
        ** with a digit or '-', then "lhs LIKE rhs" will always be false if
        ** the LHS is numeric and so the optimization still works.
        **
        ** 2018-09-10 ticket c94369cae9b561b1f996d0054bfab11389f9d033
        ** The RHS pattern must not be '/%' because the termination condition
        ** will then become "x<'0'" and if the affinity is numeric, will then
        ** be converted into "x<0", which is incorrect.
        */
        if( sqlite3Isdigit(zNew[0])
         || zNew[0]=='-'
         || (zNew[0]+1=='0' && iTo==1)
        ){
          if( pLeft->op!=TK_COLUMN 
           || sqlite3ExprAffinity(pLeft)!=SQLITE_AFF_TEXT 
           || IsVirtual(pLeft->y.pTab)  /* Value might be numeric */
          ){
            sqlite3ExprDelete(db, pPrefix);
            sqlite3ValueFree(pVal);
            return 0;
          }
        }
      }
      *ppPrefix = pPrefix;

      /* If the RHS pattern is a bound parameter, make arrangements to
      ** reprepare the statement when that parameter is rebound */
      if( op==TK_VARIABLE ){
        Vdbe *v = pParse->pVdbe;
        sqlite3VdbeSetVarmask(v, pRight->iColumn);
        if( *pisComplete && pRight->u.zToken[1] ){
          /* If the rhs of the LIKE expression is a variable, and the current
          ** value of the variable means there is no need to invoke the LIKE
          ** function, then no OP_Variable will be added to the program.
          ** This causes problems for the sqlite3_bind_parameter_name()
          ** API. To work around them, add a dummy OP_Variable here.
          */ 
          int r1 = sqlite3GetTempReg(pParse);
          sqlite3ExprCodeTarget(pParse, pRight, r1);
          sqlite3VdbeChangeP3(v, sqlite3VdbeCurrentAddr(v)-1, 0);
          sqlite3ReleaseTempReg(pParse, r1);
        }
      }
    }else{
      z = 0;
    }
  }

  rc = (z!=0);
  sqlite3ValueFree(pVal);
  return rc;
}